

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O1

void __thiscall tf::TFProfManager::TFProfManager(TFProfManager *this)

{
  char *pcVar1;
  size_t sVar2;
  char *__s;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"TF_ENABLE_PROFILER","");
  pcVar1 = getenv((char *)local_38[0]);
  __s = "";
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  (this->_fpath)._M_dataplus._M_p = (pointer)&(this->_fpath).field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)this,__s,__s + sVar2);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  (this->_observers).
  super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_observers).
  super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->_observers).
  super__Vector_base<std::shared_ptr<tf::TFProfObserver>,_std::allocator<std::shared_ptr<tf::TFProfObserver>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  return;
}

Assistant:

inline TFProfManager::TFProfManager() :
  _fpath {get_env(TF_ENABLE_PROFILER)} {

}